

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_type_createSimpleFunctionTypeWithArguments1
          (sysbvm_context_t *context,sysbvm_tuple_t argument,sysbvm_tuple_t resultType)

{
  anon_struct_16_2_94d61efe gcFrame;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  local_30 = (undefined1 *)&gcFrame;
  gcFrame.arguments = 0;
  gcFrame.result = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 2;
  sysbvm_stackFrame_pushRecord(&local_48);
  gcFrame.arguments = sysbvm_array_create(context,1);
  if ((gcFrame.arguments & 0xf) == 0 && gcFrame.arguments != 0) {
    *(sysbvm_tuple_t *)(gcFrame.arguments + 0x10) = argument;
  }
  gcFrame.result = sysbvm_type_createSimpleFunctionType(context,gcFrame.arguments,0,resultType);
  sysbvm_stackFrame_popRecord(&local_48);
  return gcFrame.result;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createSimpleFunctionTypeWithArguments1(sysbvm_context_t *context, sysbvm_tuple_t argument, sysbvm_tuple_t resultType)
{
    struct {
        sysbvm_tuple_t arguments;
        sysbvm_tuple_t result;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.arguments = sysbvm_array_create(context, 1);
    sysbvm_array_atPut(gcFrame.arguments, 0, argument);

    gcFrame.result = sysbvm_type_createSimpleFunctionType(context, gcFrame.arguments, 0, resultType);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}